

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_clock.c
# Opt level: O0

char * oonf_clock_toClockString(isonumber_str *buf,uint64_t clk)

{
  ulong uVar1;
  uint64_t sec;
  uint64_t msec;
  uint64_t clk_local;
  isonumber_str *buf_local;
  
  uVar1 = clk / 1000;
  snprintf(buf->buf,0x30,"%lu:%02lu:%02lu.%03lu",uVar1 / 0xe10,(uVar1 % 0xe10) / 0x3c,uVar1 % 0x3c,
           clk % 1000);
  return buf->buf;
}

Assistant:

const char *
oonf_clock_toClockString(struct isonumber_str *buf, uint64_t clk) {
  uint64_t msec = clk % MSEC_PER_SEC;
  uint64_t sec = clk / MSEC_PER_SEC;

  snprintf(buf->buf, sizeof(*buf), "%" PRIu64 ":%02" PRIu64 ":%02" PRIu64 ".%03" PRIu64 "", sec / 3600,
    (sec % 3600) / 60, (sec % 60), msec);

  return buf->buf;
}